

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::InternalMetadata::
DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(InternalMetadata *this)

{
  undefined8 *puVar1;
  pointer pUVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)(this->ptr_ & 0xfffffffffffffffc);
  puVar1 = puVar3;
  if ((this->ptr_ & 1U) != 0) {
    puVar1 = (undefined8 *)*puVar3;
  }
  if (puVar1 != (undefined8 *)0x0) {
    return;
  }
  if (puVar3 != (undefined8 *)0x0) {
    pUVar2 = (pointer)puVar3[1];
    if (pUVar2 != (pointer)puVar3[2]) {
      UnknownFieldSet::ClearFallback((UnknownFieldSet *)(puVar3 + 1));
      pUVar2 = (((UnknownFieldSet *)(puVar3 + 1))->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (pUVar2 != (pointer)0x0) {
      operator_delete(pUVar2);
    }
  }
  operator_delete(puVar3);
  return;
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }